

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

ssize_t __thiscall Flasher::read(Flasher *this,int __fd,void *__buf,size_t __nbytes)

{
  unique_ptr<Flash,_std::default_delete<Flash>_> *puVar1;
  _func_int *p_Var2;
  FlasherObserver *pFVar3;
  long lVar4;
  FileOpenError *pFVar5;
  void *pvVar6;
  FILE *pFVar7;
  char *__filename;
  uint uVar8;
  int iVar9;
  pointer pFVar10;
  FlashOffsetError *pFVar11;
  FileSizeError *pFVar12;
  int *piVar13;
  FileShortError *pFVar14;
  ulong uVar15;
  undefined4 in_register_00000034;
  ulong uVar16;
  undefined8 uStack_c0;
  FileShortError *local_b8;
  size_t local_b0;
  FileOpenError *local_a8;
  FileOpenError *local_a0;
  FileSizeError *local_98;
  uint local_90;
  uint local_8c;
  FlashOffsetError *local_88;
  uint local_7c;
  Flasher *local_78;
  void *local_70;
  size_t local_58;
  size_t fbytes;
  uint local_48;
  uint32_t numPages;
  uint32_t pageOffset;
  uint32_t pageNum;
  unsigned_long __vla_expr0;
  uint local_2c;
  FILE *pFStack_28;
  uint32_t pageSize;
  FILE *outfile;
  uint32_t foffset_local;
  uint32_t fsize_local;
  char *filename_local;
  Flasher *this_local;
  
  _foffset_local = (char *)CONCAT44(in_register_00000034,__fd);
  outfile._4_4_ = (uint)__buf;
  outfile._0_4_ = (uint)__nbytes;
  uStack_c0 = 0x11282a;
  local_78 = this;
  filename_local = (char *)this;
  pFVar10 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uStack_c0 = 0x112836;
  local_2c = (*pFVar10->_vptr_Flash[3])();
  _pageOffset = (ulong)local_2c;
  lVar4 = -(_pageOffset + 0xf & 0xfffffffffffffff0);
  local_70 = (void *)((long)&local_b8 + lVar4);
  numPages = 0;
  __vla_expr0 = (unsigned_long)&local_b8;
  if ((uint)outfile % local_2c == 0) {
    local_7c = (uint)outfile;
    puVar1 = local_78->_flash;
    __vla_expr0 = (unsigned_long)&local_b8;
    *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112886;
    pFVar10 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar1);
    p_Var2 = pFVar10->_vptr_Flash[6];
    *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x11288f;
    uVar8 = (*p_Var2)();
    if (local_7c < uVar8) {
      local_48 = (uint)outfile / local_2c;
      if (outfile._4_4_ == 0) {
        local_8c = local_2c;
        puVar1 = local_78->_flash;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x11290b;
        pFVar10 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar1);
        p_Var2 = pFVar10->_vptr_Flash[4];
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112914;
        iVar9 = (*p_Var2)();
        outfile._4_4_ = local_8c * (iVar9 - local_48);
      }
      fbytes._4_4_ = ((outfile._4_4_ + local_2c) - 1) / local_2c;
      local_90 = local_48 + fbytes._4_4_;
      puVar1 = local_78->_flash;
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112951;
      pFVar10 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar1);
      p_Var2 = pFVar10->_vptr_Flash[4];
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x11295a;
      uVar8 = (*p_Var2)();
      __filename = _foffset_local;
      if (uVar8 < local_90) {
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112970;
        pFVar12 = (FileSizeError *)__cxa_allocate_exception(8);
        local_98 = pFVar12;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112982;
        FileSizeError::FileSizeError(pFVar12);
        pFVar12 = local_98;
        *(undefined1 **)((long)&uStack_c0 + lVar4) = &LAB_0011299e;
        __cxa_throw(pFVar12,&FileSizeError::typeinfo,FileSizeError::~FileSizeError);
      }
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x1129cb;
      pFStack_28 = fopen(__filename,"wb");
      if (pFStack_28 == (FILE *)0x0) {
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x1129e0;
        local_a8 = (FileOpenError *)__cxa_allocate_exception(0x10);
        local_a0 = local_a8;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x1129f3;
        piVar13 = __errno_location();
        pFVar5 = local_a0;
        iVar9 = *piVar13;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112a01;
        FileOpenError::FileOpenError(pFVar5,iVar9);
        pFVar5 = local_a8;
        *(undefined1 **)((long)&uStack_c0 + lVar4) = &LAB_00112a1d;
        __cxa_throw(pFVar5,&FileOpenError::typeinfo,FileOpenError::~FileOpenError);
      }
      pFVar3 = local_78->_observer;
      uVar15 = (ulong)outfile._4_4_;
      p_Var2 = pFVar3->_vptr_FlasherObserver[2];
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112a54;
      (*p_Var2)(pFVar3,"Read %d bytes from flash\n",uVar15);
      numPages = 0;
      while( true ) {
        if (fbytes._4_4_ <= numPages) {
          pFVar3 = local_78->_observer;
          uVar16 = (ulong)fbytes._4_4_;
          uVar15 = (ulong)fbytes._4_4_;
          p_Var2 = pFVar3->_vptr_FlasherObserver[3];
          *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112bc4;
          (*p_Var2)(pFVar3,uVar16,uVar15);
          pFVar7 = pFStack_28;
          *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112bcd;
          fclose(pFVar7);
          return __vla_expr0;
        }
        pFVar3 = local_78->_observer;
        uVar16 = (ulong)numPages;
        uVar15 = (ulong)fbytes._4_4_;
        p_Var2 = pFVar3->_vptr_FlasherObserver[3];
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112a7e;
        (*p_Var2)(pFVar3,uVar16,uVar15);
        puVar1 = local_78->_flash;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112a8d;
        pFVar10 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(puVar1);
        pvVar6 = local_70;
        uVar8 = local_48 + numPages;
        p_Var2 = pFVar10->_vptr_Flash[0x19];
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112aa8;
        (*p_Var2)(pFVar10,(ulong)uVar8,pvVar6);
        pFVar7 = pFStack_28;
        pvVar6 = local_70;
        if ((numPages == fbytes._4_4_ - 1) && (outfile._4_4_ % local_2c != 0)) {
          local_2c = outfile._4_4_ % local_2c;
        }
        uVar15 = (ulong)local_2c;
        *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112af9;
        local_b0 = fwrite(pvVar6,1,uVar15,pFVar7);
        local_58 = local_b0;
        if (local_b0 != local_2c) break;
        numPages = numPages + 1;
      }
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112b23;
      pFVar14 = (FileShortError *)__cxa_allocate_exception(8);
      local_b8 = pFVar14;
      *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x112b35;
      FileShortError::FileShortError(pFVar14);
      pFVar14 = local_b8;
      *(undefined1 **)((long)&uStack_c0 + lVar4) = &LAB_00112b51;
      __cxa_throw(pFVar14,&FileShortError::typeinfo,FileShortError::~FileShortError);
    }
  }
  *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x1128a2;
  pFVar11 = (FlashOffsetError *)__cxa_allocate_exception(8);
  local_88 = pFVar11;
  *(undefined8 *)((long)&uStack_c0 + lVar4) = 0x1128b1;
  FlashOffsetError::FlashOffsetError(pFVar11);
  pFVar11 = local_88;
  *(undefined1 **)((long)&uStack_c0 + lVar4) = &LAB_001128ca;
  __cxa_throw(pFVar11,&FlashOffsetError::typeinfo,FlashOffsetError::~FlashOffsetError);
}

Assistant:

void
Flasher::read(const char* filename, uint32_t fsize, uint32_t foffset)
{
    FILE* outfile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t buffer[pageSize];
    uint32_t pageNum = 0;
    uint32_t pageOffset;
    uint32_t numPages;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
        
    pageOffset = foffset / pageSize;

    if (fsize == 0)
        fsize = pageSize * (_flash->numPages() - pageOffset);

    numPages = (fsize + pageSize - 1) / pageSize;
    if (pageOffset + numPages > _flash->numPages())
        throw FileSizeError();
    
    outfile = fopen(filename, "wb");
    if (!outfile)
        throw FileOpenError(errno);
    
    _observer.onStatus("Read %d bytes from flash\n", fsize);
    
    try
    {
        for (pageNum = 0; pageNum < numPages; pageNum++)
        {
            _observer.onProgress(pageNum, numPages);

            _flash->readPage(pageOffset + pageNum, buffer);

            if (pageNum == numPages - 1 && fsize % pageSize > 0)
                pageSize = fsize % pageSize;
            fbytes = fwrite(buffer, 1, pageSize, outfile);
            if (fbytes != pageSize)
                throw FileShortError();
        }
    }
    catch(...)
    {
        fclose(outfile);
        throw;
    }
    
    _observer.onProgress(numPages, numPages);
    
    fclose(outfile);
}